

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void __thiscall BMP::writeMatrix(BMP *this,ofstream *out)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  bool bVar4;
  int local_24;
  int local_20;
  int j;
  int i;
  bool flag;
  ofstream *out_local;
  BMP *this_local;
  
  bVar4 = out == (ofstream *)0x0;
  for (local_20 = 0; local_20 < (this->headInfo).biWidth; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < (this->headInfo).biHeight; local_24 = local_24 + 1) {
      if (bVar4) {
        _Var2 = std::setw(3);
        poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
        _Var1 = std::setfill<char>('0');
        poVar3 = std::operator<<(poVar3,_Var1._M_c);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->field[local_20][local_24]);
        std::operator<<(poVar3,' ');
      }
      else {
        _Var2 = std::setw(3);
        poVar3 = std::operator<<((ostream *)out,_Var2);
        _Var1 = std::setfill<char>('0');
        poVar3 = std::operator<<(poVar3,_Var1._M_c);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->field[local_20][local_24]);
        std::operator<<(poVar3,' ');
      }
    }
    if (bVar4) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::ostream::operator<<((ostream *)out,std::endl<char,std::char_traits<char>>);
    }
  }
  if (bVar4) {
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::ostream::operator<<((ostream *)out,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void BMP::writeMatrix(  std::ofstream *out  ) {
    using namespace std;
    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    for ( auto i = 0; i < headInfo.biWidth; i++ ) {
        for ( auto j = 0; j < headInfo.biHeight; j++ ) {
            if ( flag ) {
                ( *out ) << setw( 3 ) << setfill( '0' ) << (int)field[ i ][ j ] << ' ';
            } else {
                cout << setw( 3 ) << setfill( '0' ) << (int)field[ i ][ j ] << ' ';
            }
        }

        if (flag) {
            (*out) << endl;
        } else {
            cout << endl;
        }
    }

    if (flag) {
        (*out) << endl;
    } else {
        cout << endl;
    }
}